

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

int __thiscall
TPZFMatrix<long_double>::Redim(TPZFMatrix<long_double> *this,int64_t newRows,int64_t newCols)

{
  longdouble *plVar1;
  longdouble *plVar2;
  ulong uVar3;
  
  uVar3 = newCols * newRows;
  if (uVar3 - (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
              (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != 0) {
    plVar1 = this->fElem;
    plVar2 = this->fGiven;
    if (plVar1 != plVar2 && plVar1 != (longdouble *)0x0) {
      operator_delete__(plVar1);
      plVar2 = this->fGiven;
    }
    if ((plVar2 == (longdouble *)0x0) || (uVar3 - this->fSize != 0 && this->fSize <= (long)uVar3)) {
      if (uVar3 == 0) {
        plVar2 = (longdouble *)0x0;
      }
      else {
        plVar2 = (longdouble *)operator_new__(-(ulong)(uVar3 >> 0x3c != 0) | uVar3 * 0x10);
      }
    }
    this->fElem = plVar2;
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = newRows;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = newCols;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return 1;
}

Assistant:

inline int TPZFMatrix<TVar>::Redim(const int64_t newRows,const int64_t newCols) {
    int64_t newsize = newRows*newCols;
    int64_t size = this->fRow*this->fCol;
    if ( newsize == size) {
        this->fRow = newRows;
        this->fCol = newCols;
        Zero();
        return( 1 );
    }
    if(this->fElem && this->fElem != this->fGiven) delete []this->fElem;
    
    if(this->fGiven && newsize <= this->fSize) {
        this->fElem = this->fGiven;
    } else if(newsize == 0) {
        this->fElem = NULL;
    } else {
        this->fElem = new TVar[ newsize ] ;
    }
#ifndef PZNODEBUG
    if (newsize && this->fElem == NULL )
        Error( "Resize <memory allocation error>." );
#endif
    
    this->fRow  = newRows;
    this->fCol  = newCols;
    
    Zero();
    
    return( 1 );
}